

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

uint JsUtil::
     BaseDictionary<unsigned_int,_Js::FunctionInfo_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
     ::GetBucket(hash_t hashCode,int bucketCount,int modFunctionIndex)

{
  hash_t hVar1;
  int modFunctionIndex_local;
  int bucketCount_local;
  hash_t hashCode_local;
  
  hVar1 = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucket
                    (hashCode >> 1,bucketCount,modFunctionIndex);
  return hVar1;
}

Assistant:

static uint GetBucket(hash_t hashCode, int bucketCount, int modFunctionIndex)
        {
            return SizePolicy::GetBucket(UNTAGHASH(hashCode), bucketCount, modFunctionIndex);
        }